

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Cmd::editLine_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Cmd *this,bool mask_mode)

{
  char cVar1;
  pointer pbVar2;
  pointer pcVar3;
  size_t sVar4;
  int iVar5;
  ssize_t sVar6;
  undefined8 uVar7;
  string sVar8;
  uint uVar9;
  string *psVar10;
  Direction dir;
  char ch;
  char seq [5];
  hints_type hc;
  char local_ce;
  char local_cd;
  byte local_cc;
  char local_cb;
  byte local_ca;
  char local_c9;
  string *local_c8;
  State local_c0;
  _Any_data *local_70;
  _Manager_type *local_68;
  string *local_60;
  _Any_data local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  termios *local_38;
  
  local_c0.buf._M_dataplus._M_p = (pointer)&local_c0.buf.field_2;
  local_c0.buf._M_string_length = 0;
  local_c0.buf.field_2._M_local_buf[0] = '\0';
  local_c0.pos = 0;
  local_c0.oldpos = 0;
  local_c0.cols = 0;
  local_c0.maxrows._0_1_ = 0;
  local_c0.maxrows._1_7_ = 0;
  local_c0.history_index._0_1_ = 0;
  local_c0.history_index._1_7_ = 0;
  local_c0.mask_mode = false;
  local_c8 = (string *)__return_storage_ptr__;
  iVar5 = getColumns(this);
  local_c0.cols = (size_t)iVar5;
  local_c0.maxrows._0_1_ = 0;
  local_c0.maxrows._1_7_ = 0;
  local_c0.history_index._0_1_ = 0;
  local_c0.history_index._1_7_ = 0;
  local_c0.mask_mode = mask_mode;
  local_58._M_unused._M_object = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  addHistoryEntry(this,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_unused._0_8_ != &local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48._M_allocated_capacity + 1));
  }
  sVar6 = write(this->out_fd_,(this->prompt)._M_dataplus._M_p,(this->prompt)._M_string_length);
  if (sVar6 != -1) {
    local_38 = (termios *)&this->orig_termios_;
    local_70 = (_Any_data *)&this->hints_handler_;
    local_68 = &(this->hints_handler_).super__Function_base._M_manager;
    local_60 = local_c8 + 0x10;
switchD_00103ed6_caseD_45:
    sVar6 = read(this->in_fd_,&local_ce,1);
    psVar10 = local_c8;
    cVar1 = local_ce;
    if (sVar6 < 1) {
      *(string **)local_c8 = local_60;
      std::__cxx11::string::_M_construct<char*>
                (local_c8,local_c0.buf._M_dataplus._M_p,
                 local_c0.buf._M_dataplus._M_p + local_c0.buf._M_string_length);
LAB_00104004:
      psVar10[0x20] = (string)0x1;
      goto LAB_00104008;
    }
    uVar9 = (uint)local_ce;
    if (this->complete_key_ == uVar9) {
      uVar9 = completeLine(this,&local_c0);
      psVar10 = local_c8;
      if (cVar1 < '\0') {
        *(string **)local_c8 = local_60;
        std::__cxx11::string::_M_construct<char*>
                  (local_c8,local_c0.buf._M_dataplus._M_p,
                   local_c0.buf._M_dataplus._M_p + local_c0.buf._M_string_length);
        goto LAB_00104004;
      }
      if (cVar1 == '\0') goto switchD_00103ed6_caseD_45;
      local_ce = (char)uVar9;
    }
    dir = Prev;
    sVar4 = local_c0.pos;
    switch(uVar9 & 0xff) {
    case 1:
      goto switchD_00103ca6_caseD_1;
    case 2:
switchD_00103ca6_caseD_2:
      if (local_c0.pos == 0) goto switchD_00103ed6_caseD_45;
      sVar4 = local_c0.pos - 1;
      break;
    case 3:
      goto switchD_00103ca6_caseD_3;
    case 4:
      if (local_c0.buf._M_string_length == 0) {
        pbVar2 = (this->history_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (this->history_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar2 + -1;
        pcVar3 = pbVar2[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != &pbVar2[-1].field_2) {
          operator_delete(pcVar3,pbVar2[-1].field_2._M_allocated_capacity + 1);
        }
        goto switchD_00103ca6_caseD_3;
      }
LAB_00103df8:
      editDelete(this,&local_c0);
      goto switchD_00103ed6_caseD_45;
    case 5:
switchD_00103ca6_caseD_5:
      sVar4 = local_c0.buf._M_string_length;
      if (local_c0.pos == local_c0.buf._M_string_length) goto switchD_00103ed6_caseD_45;
      break;
    case 6:
switchD_00103ca6_caseD_6:
      if (local_c0.pos == local_c0.buf._M_string_length) goto switchD_00103ed6_caseD_45;
LAB_00103f10:
      sVar4 = local_c0.pos + 1;
      break;
    case 7:
    case 9:
    case 0xf:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x16:
    case 0x18:
    case 0x19:
      goto switchD_00103ca6_caseD_7;
    case 8:
switchD_00103ca6_caseD_8:
      editBackspace(this,&local_c0);
      goto switchD_00103ed6_caseD_45;
    case 10:
    case 0xd:
      pbVar2 = (this->history_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->history_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar2 + -1;
      pcVar3 = pbVar2[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar2[-1].field_2) {
        operator_delete(pcVar3,pbVar2[-1].field_2._M_allocated_capacity + 1);
      }
      if ((this->multiline_mode == true) && (local_c0.pos != local_c0.buf._M_string_length)) {
        local_c0.pos = local_c0.buf._M_string_length;
        refreshLine(this,&local_c0);
      }
      if (*local_68 != (_Manager_type)0x0) {
        std::
        function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>::
        function((function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)&local_58,
                 (function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)local_70);
        if (*local_68 != (_Manager_type)0x0) {
          (**local_68)(local_70,local_70,__destroy_functor);
          *local_68 = (_Manager_type)0x0;
          local_68[1] = (_Manager_type)0x0;
        }
        refreshLine(this,&local_c0);
        std::
        function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>::
        operator=((function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                   *)local_70,
                  (function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                   *)&local_58);
        if ((code *)local_48._M_allocated_capacity != (code *)0x0) {
          (*(code *)local_48._M_allocated_capacity)(&local_58,&local_58,3);
        }
      }
      *(string **)local_c8 = local_60;
      sVar8 = (string)0x1;
      std::__cxx11::string::_M_construct<char*>
                (local_c8,local_c0.buf._M_dataplus._M_p,
                 local_c0.buf._M_dataplus._M_p + local_c0.buf._M_string_length);
      goto LAB_0010415a;
    case 0xb:
      if (local_c0.buf._M_string_length < local_c0.pos) {
        uVar7 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase");
        __clang_call_terminate(uVar7);
      }
      local_c0.buf._M_string_length = local_c0.pos;
      local_c0.buf._M_dataplus._M_p[local_c0.pos] = '\0';
      break;
    case 0xc:
      write(this->out_fd_,"\x1b[H\x1b[2J",7);
      sVar4 = local_c0.pos;
      break;
    case 0xe:
switchD_00103ca6_caseD_e:
      dir = Next;
    case 0x10:
switchD_00103ca6_caseD_10:
      editHistoryNext(this,&local_c0,dir);
      goto switchD_00103ed6_caseD_45;
    case 0x14:
      if ((local_c0.pos == 0) || (local_c0.buf._M_string_length <= local_c0.pos))
      goto switchD_00103ed6_caseD_45;
      cVar1 = local_c0.buf._M_dataplus._M_p[local_c0.pos];
      local_c0.buf._M_dataplus._M_p[local_c0.pos] = local_c0.buf._M_dataplus._M_p[local_c0.pos - 1];
      local_c0.buf._M_dataplus._M_p[local_c0.pos - 1] = cVar1;
      if (local_c0.pos != local_c0.buf._M_string_length - 1) goto LAB_00103f10;
      break;
    case 0x15:
      local_c0.buf._M_string_length = 0;
      *local_c0.buf._M_dataplus._M_p = '\0';
      local_c0.pos = 0;
      sVar4 = local_c0.pos;
      break;
    case 0x17:
      editDeletePreviousWord(this,&local_c0);
      goto switchD_00103ed6_caseD_45;
    case 0x1a:
      if ((this->raw_mode_ == true) && (iVar5 = tcsetattr(this->in_fd_,2,local_38), iVar5 != -1)) {
        this->raw_mode_ = false;
      }
      raise(0x14);
      enableRawMode(this,this->in_fd_);
      sVar4 = local_c0.pos;
      break;
    case 0x1b:
      sVar6 = read(this->in_fd_,&local_cd,1);
      if ((sVar6 == -1) || (sVar6 = read(this->in_fd_,&local_cc,1), sVar6 == -1))
      goto switchD_00103ed6_caseD_45;
      if (local_cd != 'O') {
        if (local_cd == '[') {
          if (9 < (int)(char)local_cc - 0x30U) {
            switch(local_cc) {
            case 0x41:
              goto switchD_00103ca6_caseD_10;
            case 0x42:
              goto switchD_00103ca6_caseD_e;
            case 0x43:
              goto switchD_00103ca6_caseD_6;
            case 0x44:
              goto switchD_00103ca6_caseD_2;
            default:
              goto switchD_00103ed6_caseD_45;
            case 0x46:
              goto switchD_00103ca6_caseD_5;
            case 0x48:
              goto switchD_00103ca6_caseD_1;
            }
          }
          sVar6 = read(this->in_fd_,&local_cb,1);
          if (sVar6 != -1) {
            if (local_cb == ';') {
              sVar6 = read(this->in_fd_,&local_ca,1);
              if ((sVar6 != -1) && (sVar6 = read(this->in_fd_,&local_c9,1), sVar6 != -1)) {
                if (local_c9 == 'D' && (local_ca ^ 0x35) == 0) {
                  editMovePrevWord(this,&local_c0);
                }
                else if ((local_ca ^ 0x35) == 0 && local_c9 == 'C') {
                  editMoveNextWord(this,&local_c0);
                }
              }
            }
            else if ((local_cb == '~') && (local_cc == 0x33)) goto LAB_00103df8;
          }
        }
        goto switchD_00103ed6_caseD_45;
      }
      if (local_cc == 0x46) goto switchD_00103ca6_caseD_5;
      if (local_cc != 0x48) goto switchD_00103ed6_caseD_45;
switchD_00103ca6_caseD_1:
      if (local_c0.pos == 0) goto switchD_00103ed6_caseD_45;
      local_c0.pos = 0;
      sVar4 = local_c0.pos;
      break;
    default:
      if ((uVar9 & 0xff) == 0x7f) goto switchD_00103ca6_caseD_8;
switchD_00103ca6_caseD_7:
      iVar5 = editInsert(this,&local_c0,(char)uVar9);
      if (iVar5 != 0) goto switchD_00103ca6_caseD_3;
      goto switchD_00103ed6_caseD_45;
    }
    local_c0.pos = sVar4;
    refreshLine(this,&local_c0);
    goto switchD_00103ed6_caseD_45;
  }
  local_c8[0x20] = (string)0x0;
LAB_00104008:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.buf._M_dataplus._M_p != &local_c0.buf.field_2) {
    operator_delete(local_c0.buf._M_dataplus._M_p,
                    CONCAT71(local_c0.buf.field_2._M_allocated_capacity._1_7_,
                             local_c0.buf.field_2._M_local_buf[0]) + 1);
  }
  return (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_c8;
switchD_00103ca6_caseD_3:
  sVar8 = (string)0x0;
LAB_0010415a:
  local_c8[0x20] = sVar8;
  goto LAB_00104008;
}

Assistant:

std::optional<std::string> editLine(bool mask_mode) {
		State state;

		// Populate the state that we pass to functions implementing specific editing functionalities.
		state.oldpos        = 0;
		state.pos           = 0;
		state.cols          = getColumns();
		state.maxrows       = 0;
		state.history_index = 0;
		state.mask_mode     = mask_mode;

		// The latest history entry is always our current buffer, that initially is just an empty string.
		addHistoryEntry("");

		if (write_string(prompt) == -1) {
			return {};
		}

		while (true) {

			char ch;
			if (read_char(&ch) <= 0) {
				return state.buf;
			}

			// Only autocomplete when the callback is set.
			if (ch == complete_key_) {
				int r = completeLine(&state);
				// Return on errors
				if (ch < 0)
					return state.buf;

				// Read next character when 0
				if (ch == '\0')
					continue;

				ch = r;
			}

			char seq[5];
			switch (ch) {
			case LINE_FEED:
			case ENTER: // enter
				history_.pop_back();

				if (multiline_mode) {
					editMoveEnd(&state);
				}

				if (hints_handler_) {
					// Force a refresh without hints to leave the previous line as the user typed it after a newline.
					hints_type hc  = hints_handler_;
					hints_handler_ = nullptr;
					refreshLine(&state);
					hints_handler_ = hc;
				}
				return state.buf;
			case CTRL_C: // ctrl-c
				return {};
			case CTRL_Z: // ctrl-z
#ifdef SIGTSTP
				// send ourselves SIGSUSP
				disableRawMode(in_fd_);
				raise(SIGTSTP);
				// and resume
				enableRawMode(in_fd_);
				refreshLine(&state);
#endif
				continue;
			case BACKSPACE: // backspace
			case CTRL_H:    // ctrl-h
				editBackspace(&state);
				break;
			case CTRL_D: // ctrl-d, remove char at right of cursor, or if the line is empty, act as end-of-file.
				if (!state.buf.empty()) {
					editDelete(&state);
				} else {
					history_.pop_back();
					return {};
				}
				break;
			case CTRL_T: // ctrl-t, swaps current character with previous.
				if (state.pos > 0 && state.pos < state.buf.size()) {
					std::swap(state.buf[state.pos], state.buf[state.pos - 1]);

					if (state.pos != state.buf.size() - 1) {
						state.pos++;
					}
					refreshLine(&state);
				}
				break;
			case CTRL_B: // ctrl-b
				editMoveLeft(&state);
				break;
			case CTRL_F: // ctrl-f
				editMoveRight(&state);
				break;
			case CTRL_P: // ctrl-p
				editHistoryNext(&state, Direction::Prev);
				break;
			case CTRL_N: // ctrl-n
				editHistoryNext(&state, Direction::Next);
				break;
			case ESC: // escape sequence
				// Read the next two bytes representing the escape sequence.
				// Use two calls to handle slow terminals returning the two chars at different times.
				if (read_char(&seq[0]) == -1) {
					break;
				}

				if (read_char(&seq[1]) == -1) {
					break;
				}

				// ESC [ sequences.
				if (seq[0] == '[') {
					if (isdigit(seq[1])) {

						// Extended escape, read additional byte.
						if (read_char(&seq[2]) == -1) {
							break;
						}

						switch (seq[2]) {
						case '~':
							switch (seq[1]) {
							case '3': // Delete key.
								editDelete(&state);
								break;
							}
							break;
						case ';':
							// Read the next two bytes representing the escape sequence.
							// Use two calls to handle slow terminals returning the two chars at different times.
							if (read_char(&seq[3]) == -1) {
								break;
							}

							if (read_char(&seq[4]) == -1) {
								break;
							}

							if (seq[3] == '5' && seq[4] == 'D') {
								editMovePrevWord(&state);
							} else if (seq[3] == '5' && seq[4] == 'C') {
								editMoveNextWord(&state);
							}
							break;
						}
					} else {
						switch (seq[1]) {
						case 'A': // Up
							editHistoryNext(&state, Direction::Prev);
							break;
						case 'B': // Down
							editHistoryNext(&state, Direction::Next);
							break;
						case 'C': // Right
							editMoveRight(&state);
							break;
						case 'D': // Left
							editMoveLeft(&state);
							break;
						case 'H': // Home
							editMoveHome(&state);
							break;
						case 'F': // End
							editMoveEnd(&state);
							break;
						}
					}
				}

				// ESC O sequences.
				else if (seq[0] == 'O') {
					switch (seq[1]) {
					case 'H': // Home
						editMoveHome(&state);
						break;
					case 'F': // End
						editMoveEnd(&state);
						break;
					}
				}
				break;
			default:
				if (editInsert(&state, ch)) {
					return {};
				}
				break;
			case CTRL_U: // Ctrl+u, delete the whole line.
				state.buf.clear();
				state.pos = 0;
				refreshLine(&state);
				break;
			case CTRL_K: // Ctrl+k, delete from current to end of line.
				state.buf.erase(state.pos);
				refreshLine(&state);
				break;
			case CTRL_A: // Ctrl+a, go to the start of the line
				editMoveHome(&state);
				break;
			case CTRL_E: // ctrl+e, go to the end of the line
				editMoveEnd(&state);
				break;
			case CTRL_L: // ctrl+l, clear screen
				clearScreen();
				refreshLine(&state);
				break;
			case CTRL_W: // ctrl+w, delete previous word
				editDeletePreviousWord(&state);
				break;
			}
		}
		return state.buf;
	}